

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip.c
# Opt level: O3

void restore_metadata(file_stream *out,char *newpath,stat *stbuf)

{
  int iVar1;
  timespec local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  iVar1 = fchmod(out->fd,*(__mode_t *)(newpath + 0x18));
  if (iVar1 != 0) {
    msg_errno("%s: unable to preserve mode",out->name);
  }
  iVar1 = fchown(out->fd,*(__uid_t *)(newpath + 0x1c),*(__gid_t *)(newpath + 0x20));
  if (iVar1 != 0) {
    msg_errno("%s: unable to preserve owner and group",out->name);
  }
  local_38.tv_sec = *(__time_t *)(newpath + 0x48);
  local_38.tv_nsec = *(long *)(newpath + 0x50);
  local_28 = *(undefined8 *)(newpath + 0x58);
  uStack_20 = *(undefined8 *)(newpath + 0x60);
  iVar1 = futimens(out->fd,&local_38);
  if (iVar1 != 0) {
    msg_errno("%s: unable to preserve timestamps",out->name);
  }
  return;
}

Assistant:

static void
restore_metadata(struct file_stream *out, const tchar *newpath,
		 const stat_t *stbuf)
{
	restore_mode(out, stbuf);
	restore_owner_and_group(out, stbuf);
	restore_timestamps(out, newpath, stbuf);
}